

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::change(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int i,SPxId *id,
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *enterVec,
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *eta)

{
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppSVar1;
  SPxId *pSVar2;
  char cVar3;
  int iVar4;
  SPxOut *pSVar5;
  undefined8 uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_268;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_230;
  cpp_dec_float<50U,_int,_void> local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  cpp_dec_float<50U,_int,_void> local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  this->lastidx = i;
  (this->lastin).super_DataKey = id->super_DataKey;
  if ((i < 0) || ((id->super_DataKey).info == 0)) {
    (this->lastout).super_DataKey = id->super_DataKey;
    return;
  }
  ppSVar1 = (this->matrix).data;
  this->nzCount = (this->nzCount - ppSVar1[(uint)i]->memused) + enterVec->memused;
  ppSVar1[(uint)i] = enterVec;
  pSVar2 = (this->theBaseId).data;
  (this->lastout).super_DataKey = pSVar2[(uint)i].super_DataKey;
  pSVar2[(uint)i].super_DataKey = id->super_DataKey;
  this->iterCount = this->iterCount + 1;
  this->updateCount = this->updateCount + 1;
  (*this->factor->_vptr_SLinSolver[3])();
  (*this->theLP->theTime->_vptr_Timer[6])();
  if (this->factorized == false) {
    (*this->_vptr_SPxBasisBase[0xb])(this);
    return;
  }
  local_230 = eta;
  iVar4 = (*this->factor->_vptr_SLinSolver[3])();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_268,(long)iVar4,(type *)0x0);
  iVar4 = (*this->factor->_vptr_SLinSolver[4])();
  pnVar7 = &this->memFactor;
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems._24_5_ = 0;
  local_1e8.data._M_elems[7]._1_3_ = 0;
  local_1e8.data._M_elems._32_5_ = 0;
  local_1e8.data._M_elems[9]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_228,(long)this->lastMem,(type *)0x0);
  if (&local_1e8 != &pnVar7->m_backend) {
    uVar6 = *(undefined8 *)((this->memFactor).m_backend.data._M_elems + 8);
    local_1e8.data._M_elems._32_5_ = SUB85(uVar6,0);
    local_1e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_1e8.data._M_elems._0_8_ = *(undefined8 *)(pnVar7->m_backend).data._M_elems;
    local_1e8.data._M_elems._8_8_ = *(undefined8 *)((this->memFactor).m_backend.data._M_elems + 2);
    local_1e8.data._M_elems._16_8_ = *(undefined8 *)((this->memFactor).m_backend.data._M_elems + 4);
    uVar6 = *(undefined8 *)((this->memFactor).m_backend.data._M_elems + 6);
    local_1e8.data._M_elems._24_5_ = SUB85(uVar6,0);
    local_1e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
    local_1e8.exp = (this->memFactor).m_backend.exp;
    local_1e8.neg = (this->memFactor).m_backend.neg;
    local_1e8.fpclass = (this->memFactor).m_backend.fpclass;
    local_1e8.prec_elem = (this->memFactor).m_backend.prec_elem;
  }
  local_1f0 = pnVar7;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_1e8,&local_228);
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems._24_5_ = 0;
  local_1a8.data._M_elems[7]._1_3_ = 0;
  local_1a8.data._M_elems._32_5_ = 0;
  local_1a8.data._M_elems[9]._1_3_ = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&local_228,(long)(iVar4 + 1000),(type *)0x0);
  local_1a8.data._M_elems._32_5_ = local_1e8.data._M_elems._32_5_;
  local_1a8.data._M_elems[9]._1_3_ = local_1e8.data._M_elems[9]._1_3_;
  local_1a8.data._M_elems[4] = local_1e8.data._M_elems[4];
  local_1a8.data._M_elems[5] = local_1e8.data._M_elems[5];
  local_1a8.data._M_elems._24_5_ = local_1e8.data._M_elems._24_5_;
  local_1a8.data._M_elems[7]._1_3_ = local_1e8.data._M_elems[7]._1_3_;
  local_1a8.data._M_elems[0] = local_1e8.data._M_elems[0];
  local_1a8.data._M_elems[1] = local_1e8.data._M_elems[1];
  local_1a8.data._M_elems[2] = local_1e8.data._M_elems[2];
  local_1a8.data._M_elems[3] = local_1e8.data._M_elems[3];
  local_1a8.exp = local_1e8.exp;
  local_1a8.neg = local_1e8.neg;
  local_1a8.fpclass = local_1e8.fpclass;
  local_1a8.prec_elem = local_1e8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_1a8,&local_228);
  if (((local_268.fpclass == cpp_dec_float_NaN) || (local_1a8.fpclass == cpp_dec_float_NaN)) ||
     (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&local_268,&local_1a8), iVar4 < 1)) {
    pnVar7 = &this->lastFill;
    iVar4 = (*this->factor->_vptr_SLinSolver[3])();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_228,(long)iVar4,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_1a8,(long)this->nzCount,(type *)0x0);
    local_268.fpclass = cpp_dec_float_finite;
    local_268.prec_elem = 10;
    local_268.data._M_elems[0] = 0;
    local_268.data._M_elems[1] = 0;
    local_268.data._M_elems[2] = 0;
    local_268.data._M_elems[3] = 0;
    local_268.data._M_elems[4] = 0;
    local_268.data._M_elems[5] = 0;
    local_268.data._M_elems._24_5_ = 0;
    local_268.data._M_elems[7]._1_3_ = 0;
    local_268.data._M_elems._32_5_ = 0;
    local_268.data._M_elems[9]._1_3_ = 0;
    local_268.exp = 0;
    local_268.neg = false;
    if (&local_268 != &pnVar7->m_backend) {
      uVar6 = *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 8);
      local_268.data._M_elems._32_5_ = SUB85(uVar6,0);
      local_268.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_268.data._M_elems._0_8_ = *(undefined8 *)(pnVar7->m_backend).data._M_elems;
      local_268.data._M_elems._8_8_ = *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 2);
      local_268.data._M_elems._16_8_ = *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 4)
      ;
      uVar6 = *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 6);
      local_268.data._M_elems._24_5_ = SUB85(uVar6,0);
      local_268.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
      local_268.exp = (this->lastFill).m_backend.exp;
      local_268.neg = (this->lastFill).m_backend.neg;
      local_268.fpclass = (this->lastFill).m_backend.fpclass;
      local_268.prec_elem = (this->lastFill).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&local_268,&local_1a8);
    if (((local_228.fpclass == cpp_dec_float_NaN) || (local_268.fpclass == cpp_dec_float_NaN)) ||
       (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_228,&local_268), iVar4 < 1)) {
      if (this->lastNzCount < this->nzCount) {
        pSVar5 = this->spxout;
        if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_002475b0;
        local_268.data._M_elems[0] = 5;
        local_228.data._M_elems[0] = pSVar5->m_verbosity;
        (*pSVar5->_vptr_SPxOut[2])();
        pSVar5 = soplex::operator<<(this->spxout,"IBASIS05 nonzero factor triggers refactorization")
        ;
        pSVar5 = soplex::operator<<(pSVar5," nzCount= ");
        std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->nzCount);
        pSVar5 = soplex::operator<<(pSVar5," lastNzCount= ");
        std::ostream::operator<<
                  ((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->lastNzCount);
        pSVar5 = soplex::operator<<(pSVar5," nonzeroFactor= ");
        local_128.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(this->nonzeroFactor).m_backend.data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 6);
        pnVar7 = &local_128;
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->nonzeroFactor).m_backend.data._M_elems + 8);
        local_128.m_backend.exp = (this->nonzeroFactor).m_backend.exp;
        local_128.m_backend.neg = (this->nonzeroFactor).m_backend.neg;
        uVar6._0_4_ = (this->nonzeroFactor).m_backend.fpclass;
        uVar6._4_4_ = (this->nonzeroFactor).m_backend.prec_elem;
        goto LAB_0024757a;
      }
      if (this->updateCount < this->maxUpdates) {
        (*this->factor->_vptr_SLinSolver[9])(this->factor,(ulong)(uint)i,enterVec,local_230);
        this->totalUpdateCount = this->totalUpdateCount + 1;
        iVar4 = (*this->factor->_vptr_SLinSolver[1])();
        if (iVar4 == 0) {
          (*this->factor->_vptr_SLinSolver[6])(&local_228);
          if (local_228.fpclass == cpp_dec_float_NaN) {
            return;
          }
          if ((this->minStab).m_backend.fpclass == cpp_dec_float_NaN) {
            return;
          }
          iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_228,&(this->minStab).m_backend);
          if (-1 < iVar4) {
            return;
          }
        }
        pSVar5 = this->spxout;
        if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_002475b0;
        local_268.data._M_elems[0] = 5;
        local_228.data._M_elems[0] = pSVar5->m_verbosity;
        (*pSVar5->_vptr_SPxOut[2])();
        pSVar5 = soplex::operator<<(this->spxout,"IBASIS07 stability triggers refactorization");
        pSVar5 = soplex::operator<<(pSVar5," stability= ");
        (*this->factor->_vptr_SLinSolver[6])(&local_68);
        boost::multiprecision::operator<<(pSVar5->m_streams[pSVar5->m_verbosity],&local_68);
        pSVar5 = soplex::operator<<(pSVar5," minStab= ");
        local_168.m_backend.data._M_elems._0_8_ =
             *(undefined8 *)(this->minStab).m_backend.data._M_elems;
        local_168.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((this->minStab).m_backend.data._M_elems + 2);
        local_168.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((this->minStab).m_backend.data._M_elems + 4);
        local_168.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((this->minStab).m_backend.data._M_elems + 6);
        pnVar7 = &local_168;
        local_168.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((this->minStab).m_backend.data._M_elems + 8);
        local_168.m_backend.exp = (this->minStab).m_backend.exp;
        local_168.m_backend.neg = (this->minStab).m_backend.neg;
        uVar6._0_4_ = (this->minStab).m_backend.fpclass;
        uVar6._4_4_ = (this->minStab).m_backend.prec_elem;
        goto LAB_0024757a;
      }
      pSVar5 = this->spxout;
      if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_002475b0;
      local_268.data._M_elems[0] = 5;
      local_228.data._M_elems[0] = pSVar5->m_verbosity;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<(this->spxout,"IBASIS06 update count triggers refactorization");
      pSVar5 = soplex::operator<<(pSVar5," updateCount= ");
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->updateCount);
      pSVar5 = soplex::operator<<(pSVar5," maxUpdates= ");
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->maxUpdates);
    }
    else {
      pSVar5 = this->spxout;
      if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_002475b0;
      local_268.data._M_elems[0] = 5;
      local_228.data._M_elems[0] = pSVar5->m_verbosity;
      (*pSVar5->_vptr_SPxOut[2])();
      pSVar5 = soplex::operator<<(this->spxout,"IBASIS04 fill factor triggers refactorization");
      pSVar5 = soplex::operator<<(pSVar5," memory= ");
      iVar4 = (*this->factor->_vptr_SLinSolver[3])();
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],iVar4);
      pSVar5 = soplex::operator<<(pSVar5," nzCount= ");
      std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->nzCount);
      pSVar5 = soplex::operator<<(pSVar5," lastFill= ");
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar7->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 6);
      pnVar7 = &local_e8;
      local_e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->lastFill).m_backend.data._M_elems + 8);
      local_e8.m_backend.exp = (this->lastFill).m_backend.exp;
      local_e8.m_backend.neg = (this->lastFill).m_backend.neg;
      uVar6._0_4_ = (this->lastFill).m_backend.fpclass;
      uVar6._4_4_ = (this->lastFill).m_backend.prec_elem;
LAB_0024757a:
      (pnVar7->m_backend).fpclass = (int)uVar6;
      (pnVar7->m_backend).prec_elem = (int)((ulong)uVar6 >> 0x20);
      boost::multiprecision::operator<<(pSVar5->m_streams[pSVar5->m_verbosity],pnVar7);
    }
    std::endl<char,std::char_traits<char>>(pSVar5->m_streams[pSVar5->m_verbosity]);
  }
  else {
    pSVar5 = this->spxout;
    if ((pSVar5 == (SPxOut *)0x0) || ((int)pSVar5->m_verbosity < 5)) goto LAB_002475b0;
    local_268.data._M_elems[0] = 5;
    local_228.data._M_elems[0] = pSVar5->m_verbosity;
    (*pSVar5->_vptr_SPxOut[2])();
    pSVar5 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity],
               "IBASIS04 memory growth factor triggers refactorization",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity]," memory= ",9);
    iVar4 = (*this->factor->_vptr_SLinSolver[3])();
    std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],iVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity]," lastMem= ",10);
    std::ostream::operator<<((ostream *)pSVar5->m_streams[pSVar5->m_verbosity],this->lastMem);
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar5->m_streams[pSVar5->m_verbosity]," memFactor= ",0xc);
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_1f0->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_1f0->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_1f0->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_1f0->m_backend).data._M_elems + 6);
    local_a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_1f0->m_backend).data._M_elems + 8);
    local_a8.m_backend.exp = (this->memFactor).m_backend.exp;
    local_a8.m_backend.neg = (this->memFactor).m_backend.neg;
    local_a8.m_backend.fpclass = (this->memFactor).m_backend.fpclass;
    local_a8.m_backend.prec_elem = (this->memFactor).m_backend.prec_elem;
    boost::multiprecision::operator<<(pSVar5->m_streams[pSVar5->m_verbosity],&local_a8);
    cVar3 = (char)pSVar5->m_streams[pSVar5->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar5->m_streams[pSVar5->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
  }
  (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_228);
LAB_002475b0:
  (*this->_vptr_SPxBasisBase[0xb])(this);
  return;
}

Assistant:

void SPxBasisBase<R>::change(
   int i,
   SPxId& id,
   const SVectorBase<R>* enterVec,
   const SSVectorBase<R>* eta)
{

   assert(matrixIsSetup);
   assert(!id.isValid() || (enterVec != nullptr));
   assert(factor != nullptr);

   lastidx = i;
   lastin  = id;

   if(id.isValid() && i >= 0)
   {
      assert(enterVec != nullptr);

      // update the counter for nonzeros in the basis matrix
      nzCount      = nzCount - matrix[i]->size() + enterVec->size();
      // let the new id enter the basis
      matrix[i]    = enterVec;
      lastout      = theBaseId[i];
      theBaseId[i] = id;

      ++iterCount;
      ++updateCount;

      SPxOut::debug(this,
                    "factor_stats: iteration= {}, update= {}, total_update= {}, nonzero_B= {}, nonzero_LU= {}, factor_fill= {}, time= {}\n",
                    this->iteration(), updateCount, totalUpdateCount, nzCount, factor->memory(), lastFill,
                    theLP->time());

      // never factorize? Just do it !
      if(!factorized)
         factorize();

      // too much memory growth ?
      else if(R(factor->memory()) > 1000 + factor->dim() + lastMem * memFactor)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                       "IBASIS04 memory growth factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " lastMem= " << lastMem
                       << " memFactor= " << memFactor
                       << std::endl;)
         factorize();
      }

      // relative fill too high ?
      else if(R(factor->memory()) > lastFill * R(nzCount))
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS04 fill factor triggers refactorization"
                       << " memory= " << factor->memory()
                       << " nzCount= " << nzCount
                       << " lastFill= " << lastFill
                       << std::endl;)

         factorize();
      }
      // absolute fill in basis matrix too high ?
      else if(nzCount > lastNzCount)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS05 nonzero factor triggers refactorization"
                       << " nzCount= " << nzCount
                       << " lastNzCount= " << lastNzCount
                       << " nonzeroFactor= " << nonzeroFactor
                       << std::endl;)
         factorize();
      }
      // too many updates ?
      else if(updateCount >= maxUpdates)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS06 update count triggers refactorization"
                       << " updateCount= " << updateCount
                       << " maxUpdates= " << maxUpdates
                       << std::endl;)
         factorize();
      }
      else
      {
         try
         {
#ifdef MEASUREUPDATETIME
            theTime.start();
#endif
            factor->change(i, *enterVec, eta);
            totalUpdateCount++;
#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif
         }
         catch(...)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                          "IBASIS13 problems updating factorization; refactorizing basis"
                          << std::endl;)

#ifdef MEASUREUPDATETIME
            theTime.stop();
#endif

            // singularity was detected in update; we refactorize
            factorize();

            // if factorize() detects singularity, an exception is thrown, hence at this point we have a regular basis
            // and can try the update again
            assert(status() >= SPxBasisBase<R>::REGULAR);

            try
            {
#ifdef MEASUREUPDATETIME
               theTime.start();
#endif
               factor->change(i, *enterVec, eta);
               totalUpdateCount++;
#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif
            }
            // with a freshly factorized, regular basis, the update is unlikely to fail; if this happens nevertheless,
            // we have to invalidate the basis to have the statuses correct
            catch(const SPxException& F)
            {
               SPX_MSG_INFO3((*this->spxout), (*this->spxout) <<
                             "IBASIS14 problems updating factorization; invalidating factorization"
                             << std::endl;)

#ifdef MEASUREUPDATETIME
               theTime.stop();
#endif

               factorized = false;
               throw F;
            }
         }

         assert(minStab > 0.0);

         if(factor->status() != SLinSolver<R>::OK || factor->stability() < minStab)
         {
            SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IBASIS07 stability triggers refactorization"
                          << " stability= " << factor->stability()
                          << " minStab= " << minStab
                          << std::endl;)
            factorize();
         }
      }
   }
   else
      lastout = id;
}